

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O0

void __thiscall
RenX::BanDatabase::process_data(BanDatabase *this,DataBuffer *buffer,FILE *file,fpos_t pos)

{
  uchar uVar1;
  unsigned_short uVar2;
  uint uVar3;
  pointer pEVar4;
  long __t;
  unsigned_long uVar5;
  mapped_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  unsigned_long local_138;
  size_t varData_entries;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long local_90;
  rep local_88;
  duration local_80;
  unsigned_long local_78;
  rep local_70;
  unsigned_long local_68;
  duration<long,_std::ratio<1L,_1L>_> local_60;
  duration local_58;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50 [3];
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> local_38;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> entry;
  FILE *file_local;
  DataBuffer *buffer_local;
  BanDatabase *this_local;
  fpos_t pos_local;
  
  if (2 < this->m_read_version) {
    entry._M_t.
    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>.
    _M_t.
    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl =
         (__uniq_ptr_data<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>,_true,_true>
          )(__uniq_ptr_data<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>,_true,_true>
            )file;
    std::make_unique<RenX::BanDatabase::Entry>();
    pEVar4 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_38);
    (pEVar4->pos).__pos = pos.__pos;
    (pEVar4->pos).__state = pos.__state;
    uVar2 = Jupiter::DataBuffer::pop<unsigned_short>(buffer);
    pEVar4 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_38);
    pEVar4->flags = uVar2;
    if (this->m_read_version < 4) {
      __t = Jupiter::DataBuffer::pop<long>(buffer);
      local_80.__r = (rep)std::chrono::_V2::system_clock::from_time_t(__t);
      pEVar4 = std::
               unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               ::operator->(&local_38);
      (pEVar4->timestamp).__d.__r = local_80.__r;
      local_90 = Jupiter::DataBuffer::pop<long>(buffer);
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long_long,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_88,&local_90);
      pEVar4 = std::
               unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               ::operator->(&local_38);
      (pEVar4->length).__r = local_88;
    }
    else {
      local_68 = Jupiter::DataBuffer::pop<unsigned_long>(buffer);
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_60,&local_68);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<long,std::ratio<1l,1000000000l>> *)&local_58,&local_60);
      std::chrono::
      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point(local_50,&local_58);
      pEVar4 = std::
               unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               ::operator->(&local_38);
      (pEVar4->timestamp).__d.__r = (rep)local_50[0].__d.__r;
      local_78 = Jupiter::DataBuffer::pop<unsigned_long>(buffer);
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_70,&local_78);
      pEVar4 = std::
               unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               ::operator->(&local_38);
      (pEVar4->length).__r = local_70;
    }
    uVar5 = Jupiter::DataBuffer::pop<unsigned_long>(buffer);
    pEVar4 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_38);
    pEVar4->steamid = uVar5;
    uVar3 = Jupiter::DataBuffer::pop<unsigned_int>(buffer);
    pEVar4 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_38);
    pEVar4->ip = uVar3;
    uVar1 = Jupiter::DataBuffer::pop<unsigned_char>(buffer);
    pEVar4 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_38);
    pEVar4->prefix_length = uVar1;
    if (4 < this->m_read_version) {
      Jupiter::DataBuffer::pop<std::__cxx11::string>(&local_b0,buffer);
      pEVar4 = std::
               unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               ::operator->(&local_38);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&pEVar4->hwid,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    Jupiter::DataBuffer::pop<std::__cxx11::string>(&local_d0,buffer);
    pEVar4 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pEVar4->rdns,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    Jupiter::DataBuffer::pop<std::__cxx11::string>(&local_f0,buffer);
    pEVar4 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pEVar4->name,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    Jupiter::DataBuffer::pop<std::__cxx11::string>(&local_110,buffer);
    pEVar4 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pEVar4->banner,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    Jupiter::DataBuffer::pop<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&varData_entries
               ,buffer);
    pEVar4 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pEVar4->reason,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&varData_entries
              );
    std::__cxx11::string::~string((string *)&varData_entries);
    for (local_138 = Jupiter::DataBuffer::pop<unsigned_long>(buffer); local_138 != 0;
        local_138 = local_138 - 1) {
      Jupiter::DataBuffer::pop<std::__cxx11::string>(&local_158,buffer);
      pEVar4 = std::
               unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               ::operator->(&local_38);
      Jupiter::DataBuffer::pop<std::__cxx11::string>(&local_178,buffer);
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&pEVar4->varData,&local_178);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_00,&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_158);
    }
    std::
    vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
    ::push_back(&this->m_entries,&local_38);
    std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
    ~unique_ptr(&local_38);
  }
  return;
}

Assistant:

void RenX::BanDatabase::process_data(Jupiter::DataBuffer &buffer, FILE *file, fpos_t pos)
{
	if (m_read_version < 3U)
		return; // incompatible database version

	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->pos = pos;

	// Read data from buffer to entry
	entry->flags = buffer.pop<uint16_t>();
	if (m_read_version >= 4U)
	{
		entry->timestamp = std::chrono::system_clock::time_point(std::chrono::seconds(buffer.pop<uint64_t>()));
		entry->length = std::chrono::seconds(buffer.pop<uint64_t>());
	}
	else
	{
		entry->timestamp = std::chrono::system_clock::from_time_t(buffer.pop<time_t>());
		entry->length = std::chrono::seconds(static_cast<long long>(buffer.pop<time_t>()));
	}
	entry->steamid = buffer.pop<uint64_t>();
	entry->ip = buffer.pop<uint32_t>();
	entry->prefix_length = buffer.pop<uint8_t>();
	if (m_read_version >= 5U)
		entry->hwid = buffer.pop<std::string>();
	entry->rdns = buffer.pop<std::string>();
	entry->name = buffer.pop<std::string>();
	entry->banner = buffer.pop<std::string>();
	entry->reason = buffer.pop<std::string>();

	// Read varData from buffer to entry
	for (size_t varData_entries = buffer.pop<size_t>(); varData_entries != 0; --varData_entries) {
		entry->varData[buffer.pop<std::string>()] = buffer.pop<std::string>();
	}

	m_entries.push_back(std::move(entry));
}